

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O3

void handle_internal_cmd(nh_cmd_desc **cmd,nh_cmd_arg *arg,int *count)

{
  nh_menuitem_conflict *pnVar1;
  size_t __size;
  uint uVar2;
  nh_bool nVar3;
  nh_direction nVar4;
  wchar_t wVar5;
  wchar_t listlen;
  nh_menuitem_conflict *pnVar6;
  char **namelist;
  char **desclist;
  nh_cmd_desc *pnVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  nh_menuitem *_item_;
  ulong uVar13;
  int iVar14;
  wchar_t wVar15;
  uint *puVar16;
  char cmdbuf [256];
  short local_238 [128];
  wchar_t local_138 [66];
  
  wVar5 = cmdcount;
  nVar4 = (*cmd)->flags & 0x1fffffff;
  switch(nVar4) {
  case DIR_W:
  case DIR_NW:
  case DIR_N:
  case DIR_NE:
  case DIR_E:
  case DIR_SE:
  case DIR_S:
  case DIR_SW:
  case DIR_UP:
  case DIR_DOWN:
    arg->argtype = 4;
    (arg->field_1).d = nVar4;
    uVar2 = (*cmd)->flags;
    if ((uVar2 >> 0x1d & 1) == 0) {
      if ((uVar2 >> 0x1e & 1) == 0) {
        if (-1 < (int)uVar2) {
          return;
        }
        pcVar10 = "go2";
      }
      else {
        pcVar10 = "run";
      }
    }
    else {
      pcVar10 = "move";
    }
    pnVar7 = find_command(pcVar10);
    *cmd = pnVar7;
    break;
  case DIR_SELF|DIR_NW:
    display_options('\0');
    goto switchD_0010a3d5_caseD_f;
  case DIR_UP|DIR_E:
    lVar11 = (long)cmdcount;
    if (lVar11 < 1) {
      iVar12 = 0;
    }
    else {
      lVar8 = 0;
      iVar12 = 0;
      do {
        iVar12 = iVar12 + (uint)((*(uint *)(commandlist->desc + lVar8 + 0x54) >> 10 & 1) != 0);
        lVar8 = lVar8 + 0x6c;
      } while (lVar11 * 0x6c - lVar8 != 0);
    }
    listlen = iVar12 + L'\x01';
    lVar8 = (long)iVar12;
    __size = lVar8 * 8 + 8;
    namelist = (char **)malloc(__size);
    desclist = (char **)malloc(__size);
    namelist[lVar8] = "?";
    desclist[lVar8] = "get this list of extended commands";
    if (L'\0' < wVar5) {
      iVar9 = 0;
      pnVar7 = commandlist;
      do {
        if ((pnVar7->flags & 0x400) != 0) {
          namelist[iVar9] = pnVar7->name;
          desclist[iVar9] = pnVar7->desc;
          iVar9 = iVar9 + 1;
        }
        pnVar7 = pnVar7 + 1;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    nVar3 = curses_get_ext_cmd((char *)local_238,namelist,desclist,listlen);
    if (nVar3 != '\0') {
      do {
        if (local_238[0] == 0x3f) {
          pnVar6 = (nh_menuitem_conflict *)malloc((lVar8 + 1) * 0x10c);
          if (iVar12 < 0) {
            wVar5 = L'\0';
          }
          else {
            lVar11 = 0x10a;
            uVar13 = 0;
            wVar15 = listlen;
            do {
              sprintf((char *)local_138," %s\t- %s.",namelist[uVar13]);
              if ((long)wVar15 <= (long)uVar13) {
                wVar15 = wVar15 * 2;
                pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)wVar15 * 0x10c);
              }
              pcVar10 = pnVar6->caption + lVar11 + -8;
              *(undefined8 *)(pcVar10 + -0x10a) = 0;
              *(undefined2 *)(pcVar10 + -2) = MI_TEXT >> 0x10;
              *pcVar10 = '\0';
              strcpy(pcVar10 + -0x102,(char *)local_138);
              uVar13 = uVar13 + 1;
              lVar11 = lVar11 + 0x10c;
              wVar5 = listlen;
            } while ((uint)listlen != uVar13);
          }
          curses_display_menu(pnVar6,wVar5,"Extended Commands List",L'\0',(wchar_t *)0x0);
        }
        else {
          pnVar7 = find_command((char *)local_238);
          if ((pnVar7 != (nh_cmd_desc *)0x0) && (-1 < (int)pnVar7->flags)) goto LAB_0010a91b;
          sprintf((char *)local_138,"%s: unknown extended command.",local_238);
          curses_msgwin((char *)local_138);
        }
        nVar3 = curses_get_ext_cmd((char *)local_238,namelist,desclist,listlen);
      } while (nVar3 != '\0');
    }
    pnVar7 = (nh_cmd_desc *)0x0;
LAB_0010a91b:
    free(namelist);
    free(desclist);
    *cmd = pnVar7;
    break;
  case DIR_UP|DIR_SE:
    arg->argtype = 2;
    pnVar6 = (nh_menuitem_conflict *)malloc(0xa78);
    pnVar6->id = L'\x01';
    pnVar6->role = MI_NORMAL;
    pnVar6->accel = '\0';
    pnVar6->group_accel = '\0';
    pnVar6->selected = '\0';
    builtin_strncpy(pnVar6->caption,"describe game commands",0x17);
    pnVar6[1].id = L'\x02';
    pnVar6[1].role = MI_NORMAL;
    pnVar6[1].accel = '\0';
    pnVar6[1].group_accel = '\0';
    pnVar6[1].selected = '\0';
    pnVar6[1].caption[0] = 'd';
    pnVar6[1].caption[1] = 'e';
    pnVar6[1].caption[2] = 's';
    pnVar6[1].caption[3] = 'c';
    pnVar6[1].caption[4] = 'r';
    pnVar6[1].caption[5] = 'i';
    pnVar6[1].caption[6] = 'b';
    pnVar6[1].caption[7] = 'e';
    pnVar6[1].caption[8] = ' ';
    pnVar6[1].caption[9] = 'w';
    pnVar6[1].caption[10] = 'h';
    pnVar6[1].caption[0xb] = 'a';
    pnVar6[1].caption[0xc] = 't';
    pnVar6[1].caption[0xd] = ' ';
    pnVar6[1].caption[0xe] = 'a';
    pnVar6[1].caption[0xf] = ' ';
    pnVar6[1].caption[9] = 'w';
    pnVar6[1].caption[10] = 'h';
    pnVar6[1].caption[0xb] = 'a';
    pnVar6[1].caption[0xc] = 't';
    pnVar6[1].caption[0xd] = ' ';
    pnVar6[1].caption[0xe] = 'a';
    pnVar6[1].caption[0xf] = ' ';
    pnVar6[1].caption[0x10] = 'k';
    pnVar6[1].caption[0x11] = 'e';
    pnVar6[1].caption[0x12] = 'y';
    pnVar6[1].caption[0x13] = ' ';
    pnVar6[1].caption[0x14] = 'd';
    pnVar6[1].caption[0x15] = 'o';
    pnVar6[1].caption[0x16] = 'e';
    pnVar6[1].caption[0x17] = 's';
    pnVar6[1].caption[0x18] = '\0';
    pnVar6[2].id = L'\x03';
    pnVar6[2].role = MI_NORMAL;
    pnVar6[2].accel = '\0';
    pnVar6[2].group_accel = '\0';
    pnVar6[2].selected = '\0';
    pnVar6[2].caption[0x10] = '\0';
    pnVar6[2].caption[0] = 'd';
    pnVar6[2].caption[1] = 'e';
    pnVar6[2].caption[2] = 's';
    pnVar6[2].caption[3] = 'c';
    pnVar6[2].caption[4] = 'r';
    pnVar6[2].caption[5] = 'i';
    pnVar6[2].caption[6] = 'b';
    pnVar6[2].caption[7] = 'e';
    pnVar6[2].caption[8] = ' ';
    pnVar6[2].caption[9] = 'o';
    pnVar6[2].caption[10] = 'p';
    pnVar6[2].caption[0xb] = 't';
    pnVar6[2].caption[0xc] = 'i';
    pnVar6[2].caption[0xd] = 'o';
    pnVar6[2].caption[0xe] = 'n';
    pnVar6[2].caption[0xf] = 's';
    if (cmdcount < L'\x01') {
      iVar12 = 10;
      iVar9 = 3;
    }
    else {
      puVar16 = &commandlist->flags;
      iVar9 = 3;
      iVar12 = 10;
      lVar11 = 0;
      wVar5 = cmdcount;
      do {
        if ((*puVar16 & 0x1000) != 0) {
          if (iVar12 <= iVar9) {
            iVar12 = iVar12 * 2;
            pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)iVar12 * 0x10c);
          }
          pnVar1 = pnVar6 + iVar9;
          pnVar1->id = (int)lVar11 + L'd';
          pnVar1->role = MI_NORMAL;
          pnVar1->accel = '\0';
          pnVar1->group_accel = '\0';
          pnVar1->selected = '\0';
          strcpy(pnVar1->caption,(char *)(puVar16 + -0x15));
          iVar9 = iVar9 + 1;
          wVar5 = cmdcount;
        }
        lVar11 = lVar11 + 1;
        puVar16 = puVar16 + 0x1b;
      } while (lVar11 < wVar5);
      if (iVar12 <= iVar9) {
        iVar12 = iVar12 * 2;
        pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)iVar12 * 0x10c);
      }
    }
    pnVar6[iVar9].id = L'\0';
    pnVar6[iVar9].role = MI_NORMAL;
    pnVar6[iVar9].accel = '\0';
    pnVar6[iVar9].group_accel = '\0';
    pnVar6[iVar9].selected = '\0';
    pnVar6[iVar9].caption[0] = '\0';
    iVar14 = iVar9 + 1;
    if (iVar12 <= iVar14) {
      pnVar6 = (nh_menuitem_conflict *)realloc(pnVar6,(long)(iVar12 * 2) * 0x10c);
    }
    pnVar6[iVar14].id = L'\x04';
    pnVar6[iVar14].role = MI_NORMAL;
    pnVar6[iVar14].accel = '?';
    pnVar6[iVar14].group_accel = '\0';
    pnVar6[iVar14].selected = '\0';
    builtin_strncpy(pnVar6[iVar14].caption,"show quick refer",0x10);
    builtin_strncpy(pnVar6[iVar14].caption + 0xd,"ference",8);
    wVar5 = curses_display_menu(pnVar6,iVar9 + L'\x02',"Help topics:",L'\x01',local_138);
    free(pnVar6);
    if (wVar5 < L'\x01') goto LAB_0010a968;
    switch(local_138[0]) {
    case L'\x01':
      show_keymap_menu('\x01');
      break;
    case L'\x02':
      show_whatdoes();
      break;
    case L'\x03':
      print_options();
      break;
    case L'\x04':
      pnVar7 = (nh_cmd_desc *)0x0;
      curses_display_menu((nh_menuitem_conflict *)&show_quickref_refitems,L'Z',"Quick reference:",
                          L'\0',(wchar_t *)0x0);
      goto LAB_0010a96a;
    default:
      pnVar7 = (nh_cmd_desc *)0x0;
      if ((L'c' < local_138[0]) && (local_138[0] + L'\xffffff9c' < cmdcount)) {
        pnVar7 = commandlist + (uint)(local_138[0] + L'\xffffff9c');
      }
      goto LAB_0010a96a;
    }
LAB_0010a968:
    pnVar7 = (nh_cmd_desc *)0x0;
LAB_0010a96a:
    *cmd = pnVar7;
    break;
  case DIR_UP|DIR_S:
    *cmd = prev_cmd;
    *arg = prev_arg;
    *count = prev_count;
    break;
  case DIR_UP|DIR_SW:
  case 0x12:
    goto switchD_0010a3d5_caseD_f;
  case 0x10:
    doprev_message();
    goto switchD_0010a3d5_caseD_f;
  case 0x11:
    show_whatdoes();
switchD_0010a3d5_caseD_f:
    *cmd = (nh_cmd_desc *)0x0;
  }
  return;
}

Assistant:

void handle_internal_cmd(struct nh_cmd_desc **cmd, struct nh_cmd_arg *arg, int *count)
{
    int id = (*cmd)->flags & ~(CMD_UI | DIRCMD | DIRCMD_SHIFT | DIRCMD_CTRL);
    switch (id) {
	case DIR_NW: case DIR_N: case DIR_NE:
	case DIR_E:              case DIR_W:
	case DIR_SW: case DIR_S: case DIR_SE:
	case DIR_UP: case DIR_DOWN:
	    arg->argtype = CMD_ARG_DIR;
	    arg->d = id;
	    if ((*cmd)->flags & DIRCMD)
		*cmd = find_command("move");
	    else if((*cmd)->flags & DIRCMD_SHIFT)
		*cmd = find_command("run");
	    else if((*cmd)->flags & DIRCMD_CTRL)
		*cmd = find_command("go2");
	    break;

	case UICMD_OPTIONS:
	    display_options(FALSE);
	    *cmd = NULL;
	    break;

	case UICMD_EXTCMD:
	    *cmd = doextcmd();
	    break;

	case UICMD_HELP:
	    arg->argtype = CMD_ARG_NONE;
	    *cmd = show_help();
	    break;

	case UICMD_REDO:
	    *cmd = prev_cmd;
	    *arg = prev_arg;
	    *count = prev_count;
	    break;

	case UICMD_REPEATPREFIX:
	    *cmd = NULL;
	    break;

	case UICMD_PREVMSG:
	    doprev_message();
	    *cmd = NULL;
	    break;

	case UICMD_WHATDOES:
	    show_whatdoes();
	    *cmd = NULL;
	    break;

	case UICMD_NOTHING:
	    *cmd = NULL;
	    break;
    }
}